

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O2

void __thiscall SAT::simplifyDB(SAT *this)

{
  Clause **ppCVar1;
  Clause *c;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = 0;
  for (uVar5 = 0; uVar5 < (this->learnts).sz; uVar5 = uVar5 + 1) {
    bVar2 = simplify(this,(this->learnts).data[uVar5]);
    ppCVar1 = (this->learnts).data;
    c = ppCVar1[uVar5];
    if (bVar2) {
      removeClause(this,c);
      uVar4 = uVar3;
    }
    else {
      uVar4 = (ulong)((uint)uVar3 + 1);
      ppCVar1[uVar3] = c;
    }
    uVar3 = uVar4;
  }
  (this->learnts).sz = (uint)uVar3;
  this->next_simp_db = this->clauses_literals + this->propagations + this->learnts_literals;
  return;
}

Assistant:

void SAT::simplifyDB() {
	unsigned int i;
	unsigned int j;
	for (i = j = 0; i < learnts.size(); i++) {
		if (simplify(*learnts[i])) {
			removeClause(*learnts[i]);
		} else {
			learnts[j++] = learnts[i];
		}
	}
	learnts.resize(j);
	next_simp_db = propagations + clauses_literals + learnts_literals;
}